

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_name.c
# Opt level: O3

ares_status_t
ares_dns_name_write(ares_buf_t *buf,ares_llist_t **list,ares_bool_t validate_hostname,char *name)

{
  int iVar1;
  ares_bool_t aVar2;
  uint uVar3;
  ares_status_t aVar4;
  size_t sVar5;
  ares_buf_t *paVar6;
  ulong uVar7;
  ares_llist_node_t *paVar8;
  undefined8 *puVar9;
  ares_buf_t *paVar10;
  ares_llist_t *paVar11;
  char *pcVar12;
  size_t sVar13;
  uchar *data;
  undefined7 uVar14;
  bool bVar15;
  long lVar16;
  ares_llist_t **ppaVar17;
  byte b;
  ares_buf_t *paVar18;
  bool bVar19;
  uchar c;
  char name_copy [512];
  byte local_289;
  undefined8 *local_288;
  size_t local_280;
  ares_bool_t local_274;
  ares_buf_t *local_270;
  ulong local_268;
  undefined4 local_25c;
  ulong local_258;
  ares_llist_t **local_250;
  char *local_248;
  undefined8 local_240;
  uchar local_238 [520];
  
  pcVar12 = name;
  sVar5 = ares_buf_len(buf);
  uVar14 = (undefined7)((ulong)pcVar12 >> 8);
  if (name == (char *)0x0 || buf == (ares_buf_t *)0x0) {
    return ARES_EFORMERR;
  }
  local_274 = validate_hostname;
  paVar6 = (ares_buf_t *)ares_array_create(8,ares_dns_labels_free_cb);
  if (paVar6 == (ares_buf_t *)0x0) {
    return ARES_ENOMEM;
  }
  uVar7 = ares_strcpy((char *)local_238,name,0x200);
  local_25c = (undefined4)CONCAT71(uVar14,1);
  local_268 = uVar7;
  local_250 = list;
  local_248 = name;
  local_240 = sVar5;
  if (list == (ares_llist_t **)0x0) {
    local_288 = (undefined8 *)0x0;
  }
  else {
    paVar11 = *list;
    sVar5 = ares_strlen((char *)local_238);
    if ((sVar5 == 0 || paVar11 == (ares_llist_t *)0x0) ||
       (paVar8 = ares_llist_node_first(paVar11), paVar8 == (ares_llist_node_t *)0x0)) {
      local_288 = (undefined8 *)0x0;
      uVar7 = local_268;
    }
    else {
      local_288 = (undefined8 *)0x0;
      local_270 = paVar6;
      do {
        puVar9 = (undefined8 *)ares_llist_node_val(paVar8);
        uVar7 = puVar9[1];
        if (((uVar7 <= sVar5) &&
            (((local_288 == (undefined8 *)0x0 || ((ulong)local_288[1] <= uVar7)) &&
             (aVar2 = ares_streq((char *)*puVar9,(char *)(local_238 + (sVar5 - uVar7))),
             aVar2 != ARES_FALSE)))) &&
           ((sVar5 == uVar7 || (local_238[(sVar5 - uVar7) + -1] == '.')))) {
          local_288 = puVar9;
        }
        paVar8 = ares_llist_node_next(paVar8);
      } while (paVar8 != (ares_llist_node_t *)0x0);
      paVar6 = local_270;
      if (local_288 != (undefined8 *)0x0) {
        if (local_288[1] == local_268) {
          local_258 = local_268;
          uVar7 = local_258;
        }
        else {
          uVar7 = ~local_288[1] + local_268;
          local_238[uVar7] = '\0';
          if (local_288[1] != local_268) {
            local_25c = 0;
            goto LAB_00120135;
          }
        }
        goto LAB_00120356;
      }
      local_288 = (undefined8 *)0x0;
      uVar7 = local_268;
    }
  }
LAB_00120135:
  paVar10 = ares_buf_create();
  if (paVar10 != (ares_buf_t *)0x0) {
    if (local_238[0] != '\0') {
      sVar5 = ares_strlen((char *)local_238);
      aVar4 = ares_buf_append(paVar10,local_238,sVar5);
      if (aVar4 != ARES_SUCCESS) goto LAB_00120505;
    }
    local_270 = ares_dns_labels_add((ares_array_t *)paVar6);
    if (local_270 != (ares_buf_t *)0x0) {
      local_258 = uVar7;
LAB_00120194:
      aVar4 = ares_buf_fetch_bytes(paVar10,&local_289,1);
      if (aVar4 != ARES_SUCCESS) {
        puVar9 = (undefined8 *)ares_array_last((ares_array_t *)paVar6);
        if (puVar9 == (undefined8 *)0x0) {
          paVar18 = (ares_buf_t *)0x0;
        }
        else {
          paVar18 = (ares_buf_t *)*puVar9;
        }
        sVar5 = ares_buf_len(paVar18);
        if (sVar5 == 0) {
          ares_array_remove_last((ares_array_t *)paVar6);
        }
        sVar5 = ares_array_len((ares_array_t *)paVar6);
        if (sVar5 == 1) {
          puVar9 = (undefined8 *)ares_array_last((ares_array_t *)paVar6);
          if (puVar9 == (undefined8 *)0x0) {
            paVar18 = (ares_buf_t *)0x0;
          }
          else {
            paVar18 = (ares_buf_t *)*puVar9;
          }
          sVar5 = ares_buf_len(paVar18);
          if (sVar5 == 0) {
            ares_array_remove_last((ares_array_t *)paVar6);
          }
        }
        sVar5 = ares_array_len((ares_array_t *)paVar6);
        if (sVar5 != 0) {
          lVar16 = 0;
          sVar5 = 0;
          goto LAB_001204bd;
        }
        lVar16 = -0x101;
        goto LAB_00120531;
      }
      if (local_289 == 0x5c) {
        aVar4 = ares_buf_fetch_bytes(paVar10,(uchar *)&local_280,1);
        if (aVar4 != ARES_SUCCESS) goto LAB_001204ff;
        uVar7 = local_280 & 0xff;
        if ((byte)((byte)local_280 - 0x30) < 10) {
          uVar7 = (ulong)((byte)local_280 - 0x30);
          bVar19 = true;
          do {
            bVar15 = bVar19;
            aVar4 = ares_buf_fetch_bytes(paVar10,(uchar *)&local_280,1);
            if (aVar4 != ARES_SUCCESS) goto LAB_001204ff;
            if (9 < (byte)((byte)local_280 - 0x30)) goto LAB_001204ff;
            iVar1 = (uint)(byte)local_280 + (int)uVar7 * 10;
            uVar7 = (ulong)(iVar1 - 0x30U);
            bVar19 = false;
          } while (bVar15);
          if (0xff < iVar1 - 0x30U) goto LAB_001204ff;
          if ((((9 < iVar1 - 0x60U) && (local_274 != ARES_FALSE)) && (0x19 < iVar1 - 0x91U)) &&
             (0x19 < iVar1 - 0x71U)) {
LAB_001202be:
            uVar3 = ((uint)uVar7 & 0xff) - 0x2a;
            if ((0x35 < uVar3) || ((0x20000000000039U >> ((ulong)uVar3 & 0x3f) & 1) == 0))
            goto LAB_001204ff;
          }
        }
        else if ((local_274 != ARES_FALSE) && (0x19 < (byte)(((byte)local_280 & 0xdf) + 0xbf)))
        goto LAB_001202be;
        b = (byte)uVar7;
      }
      else {
        if (local_289 == 0x2e) {
          local_270 = ares_dns_labels_add((ares_array_t *)paVar6);
          if (local_270 == (ares_buf_t *)0x0) goto LAB_00120313;
          goto LAB_00120194;
        }
        b = local_289;
        if (((local_274 != ARES_FALSE) && (9 < (byte)(local_289 - 0x30))) &&
           (0x19 < (byte)((local_289 & 0xdf) + 0xbf))) {
          aVar4 = ARES_EBADNAME;
          if ((local_289 - 0x2a < 0x36) &&
             ((0x20000000000029U >> ((ulong)(local_289 - 0x2a) & 0x3f) & 1) != 0))
          goto LAB_001202eb;
          goto LAB_00120505;
        }
      }
LAB_001202eb:
      aVar4 = ares_buf_append_byte(local_270,b);
      if (aVar4 != ARES_SUCCESS) goto LAB_00120505;
      goto LAB_00120194;
    }
  }
LAB_00120313:
  aVar4 = ARES_ENOMEM;
LAB_00120505:
  ares_buf_destroy(paVar10);
LAB_0012050d:
  ares_array_destroy((ares_array_t *)paVar6);
  return aVar4;
  while( true ) {
    lVar16 = lVar16 + sVar13;
    sVar5 = sVar5 + 1;
    sVar13 = ares_array_len((ares_array_t *)paVar6);
    if (sVar13 <= sVar5) break;
LAB_001204bd:
    puVar9 = (undefined8 *)ares_array_at((ares_array_t *)paVar6,sVar5);
    if (puVar9 == (undefined8 *)0x0) {
      paVar18 = (ares_buf_t *)0x0;
    }
    else {
      paVar18 = (ares_buf_t *)*puVar9;
    }
    sVar13 = ares_buf_len(paVar18);
    if (sVar13 - 0x40 < 0xffffffffffffffc1) goto LAB_001204ff;
  }
  lVar16 = lVar16 + -0x101;
LAB_00120531:
  sVar5 = ares_array_len((ares_array_t *)paVar6);
  if (sVar5 != 0) {
    sVar5 = ares_array_len((ares_array_t *)paVar6);
    aVar4 = ARES_EBADNAME;
    if (sVar5 + lVar16 < 0xffffffffffffff00) goto LAB_00120505;
  }
  ares_buf_destroy(paVar10);
  sVar5 = ares_array_len((ares_array_t *)paVar6);
  if (sVar5 != 0) {
    sVar5 = 0;
    do {
      local_280 = 0;
      puVar9 = (undefined8 *)ares_array_at((ares_array_t *)paVar6,sVar5);
      if (puVar9 == (undefined8 *)0x0) {
        paVar10 = (ares_buf_t *)0x0;
      }
      else {
        paVar10 = (ares_buf_t *)*puVar9;
      }
      data = ares_buf_peek(paVar10,&local_280);
      aVar4 = ares_buf_append_byte(buf,(byte)local_280);
      if ((aVar4 != ARES_SUCCESS) ||
         (aVar4 = ares_buf_append(buf,data,local_280), aVar4 != ARES_SUCCESS)) goto LAB_0012050d;
      sVar5 = sVar5 + 1;
      sVar13 = ares_array_len((ares_array_t *)paVar6);
    } while (sVar5 < sVar13);
  }
  ppaVar17 = local_250;
  uVar7 = local_258;
  if ((char)local_25c == '\0') {
LAB_00120356:
    local_258 = uVar7;
    ppaVar17 = local_250;
    puVar9 = local_288;
    bVar19 = local_250 == (ares_llist_t **)0x0;
    aVar4 = ares_buf_append_be16(buf,*(ushort *)(local_288 + 2) | 0xc000);
    if (((aVar4 != ARES_SUCCESS || bVar19) || (aVar4 = ARES_SUCCESS, local_258 == 0)) ||
       (puVar9[1] == local_268)) goto LAB_0012050d;
  }
  else {
    bVar19 = local_250 == (ares_llist_t **)0x0;
    aVar4 = ares_buf_append_byte(buf,'\0');
    if ((aVar4 != ARES_SUCCESS || bVar19) || (aVar4 = ARES_SUCCESS, local_258 == 0))
    goto LAB_0012050d;
  }
  pcVar12 = local_248;
  sVar5 = ares_strlen(local_248);
  aVar4 = ARES_EFORMERR;
  if ((sVar5 == 0) || (sVar5 = ares_strlen(pcVar12), 0xff < sVar5)) goto LAB_0012050d;
  if (*ppaVar17 == (ares_llist_t *)0x0) {
    paVar11 = ares_llist_create(ares_nameoffset_free);
    *ppaVar17 = paVar11;
    if (paVar11 != (ares_llist_t *)0x0) goto LAB_001203ef;
    puVar9 = (undefined8 *)0x0;
LAB_00120627:
    ares_nameoffset_free(puVar9);
  }
  else {
LAB_001203ef:
    puVar9 = (undefined8 *)ares_malloc_zero(0x18);
    if (puVar9 != (undefined8 *)0x0) {
      pcVar12 = ares_strdup(local_248);
      *puVar9 = pcVar12;
      sVar5 = ares_strlen(pcVar12);
      puVar9[1] = sVar5;
      puVar9[2] = local_240;
      paVar8 = ares_llist_insert_last(*ppaVar17,puVar9);
      aVar4 = ARES_SUCCESS;
      if (paVar8 != (ares_llist_node_t *)0x0) goto LAB_0012050d;
      goto LAB_00120627;
    }
  }
  aVar4 = ARES_ENOMEM;
  goto LAB_0012050d;
LAB_001204ff:
  aVar4 = ARES_EBADNAME;
  goto LAB_00120505;
}

Assistant:

ares_status_t ares_dns_name_write(ares_buf_t *buf, ares_llist_t **list,
                                  ares_bool_t validate_hostname,
                                  const char *name)
{
  const ares_nameoffset_t *off = NULL;
  size_t                   name_len;
  size_t                   orig_name_len;
  size_t                   pos    = ares_buf_len(buf);
  ares_array_t            *labels = NULL;
  char                     name_copy[512];
  ares_status_t            status;

  if (buf == NULL || name == NULL) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  labels = ares_array_create(sizeof(ares_buf_t *), ares_dns_labels_free_cb);
  if (labels == NULL) {
    return ARES_ENOMEM;
  }

  /* NOTE: due to possible escaping, name_copy buffer is > 256 to allow for
   *       this */
  name_len      = ares_strcpy(name_copy, name, sizeof(name_copy));
  orig_name_len = name_len;

  /* Find longest match */
  if (list != NULL) {
    off = ares_nameoffset_find(*list, name_copy);
    if (off != NULL && off->name_len != name_len) {
      /* truncate */
      name_len            -= (off->name_len + 1);
      name_copy[name_len]  = 0;
    }
  }

  /* Output labels */
  if (off == NULL || off->name_len != orig_name_len) {
    size_t i;

    status = ares_split_dns_name(labels, validate_hostname, name_copy);
    if (status != ARES_SUCCESS) {
      goto done;
    }

    for (i = 0; i < ares_array_len(labels); i++) {
      size_t               len  = 0;
      const ares_buf_t    *lbuf = ares_dns_labels_get_at(labels, i);
      const unsigned char *ptr  = ares_buf_peek(lbuf, &len);

      status = ares_buf_append_byte(buf, (unsigned char)(len & 0xFF));
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }

      status = ares_buf_append(buf, ptr, len);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }

    /* If we are NOT jumping to another label, output terminator */
    if (off == NULL) {
      status = ares_buf_append_byte(buf, 0);
      if (status != ARES_SUCCESS) {
        goto done; /* LCOV_EXCL_LINE: OutOfMemory */
      }
    }
  }

  /* Output name compression offset jump */
  if (off != NULL) {
    unsigned short u16 =
      (unsigned short)0xC000 | (unsigned short)(off->idx & 0x3FFF);
    status = ares_buf_append_be16(buf, u16);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  /* Store pointer for future jumps as long as its not an exact match for
   * a prior entry */
  if (list != NULL && (off == NULL || off->name_len != orig_name_len) &&
      name_len > 0) {
    status = ares_nameoffset_create(list, name /* not truncated copy! */, pos);
    if (status != ARES_SUCCESS) {
      goto done; /* LCOV_EXCL_LINE: OutOfMemory */
    }
  }

  status = ARES_SUCCESS;

done:
  ares_array_destroy(labels);
  return status;
}